

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetMinInputEdgeIds
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this)

{
  EdgeId EVar1;
  InputEdgeId IVar2;
  reference pvVar3;
  int local_30;
  EdgeId e;
  allocator<int> local_1a;
  undefined1 local_19;
  Graph *local_18;
  Graph *this_local;
  vector<int,_std::allocator<int>_> *min_input_ids;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Graph *)__return_storage_ptr__;
  EVar1 = num_edges(this);
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)EVar1,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  for (local_30 = 0; EVar1 = num_edges(this), local_30 < EVar1; local_30 = local_30 + 1) {
    IVar2 = min_input_edge_id(this,local_30);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (__return_storage_ptr__,(long)local_30);
    *pvVar3 = IVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2Builder::InputEdgeId> Graph::GetMinInputEdgeIds() const {
  vector<InputEdgeId> min_input_ids(num_edges());
  for (EdgeId e = 0; e < num_edges(); ++e) {
    min_input_ids[e] = min_input_edge_id(e);
  }
  return min_input_ids;
}